

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_sse2.c
# Opt level: O0

uint64_t aom_sum_squares_2d_i16_4xn_sse2(int16_t *src,int stride,int height)

{
  uint64_t uVar1;
  int in_EDX;
  uint in_ESI;
  ulong uVar2;
  long in_RDI;
  long lVar3;
  int16_t *extraout_XMM0_Qa;
  __m128i a;
  __m128i v_acc_64;
  __m128i v_zext_mask_q;
  __m128i v_acc_d;
  __m128i v_acc_q;
  int r;
  undefined4 local_fc;
  int16_t *in_stack_ffffffffffffff18;
  
  local_fc = 0;
  do {
    uVar2 = (ulong)in_ESI;
    lVar3 = in_RDI;
    sum_squares_i16_4x4_sse2(in_stack_ffffffffffffff18,(int)((ulong)in_RDI >> 0x20));
    in_RDI = in_RDI + (long)(int)(in_ESI << 2) * 2;
    local_fc = local_fc + 4;
    in_stack_ffffffffffffff18 = extraout_XMM0_Qa;
  } while (local_fc < in_EDX);
  a[1] = uVar2;
  a[0] = lVar3;
  uVar1 = xx_cvtsi128_si64(a);
  return uVar1;
}

Assistant:

uint64_t aom_sum_squares_2d_i16_4xn_sse2(const int16_t *src, int stride,
                                         int height) {
  int r = 0;
  __m128i v_acc_q = _mm_setzero_si128();
  do {
    const __m128i v_acc_d = sum_squares_i16_4x4_sse2(src, stride);
    v_acc_q = _mm_add_epi32(v_acc_q, v_acc_d);
    src += stride << 2;
    r += 4;
  } while (r < height);
  const __m128i v_zext_mask_q = _mm_set1_epi64x(~0u);
  __m128i v_acc_64 = _mm_add_epi64(_mm_srli_epi64(v_acc_q, 32),
                                   _mm_and_si128(v_acc_q, v_zext_mask_q));
  v_acc_64 = _mm_add_epi64(v_acc_64, _mm_srli_si128(v_acc_64, 8));
  return xx_cvtsi128_si64(v_acc_64);
}